

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OPC_OptimizedTree.cpp
# Opt level: O3

void __thiscall Opcode::AABBNoLeafTree::~AABBNoLeafTree(AABBNoLeafTree *this)

{
  AABBNoLeafNode *pAVar1;
  
  (this->super_AABBOptimizedTree)._vptr_AABBOptimizedTree =
       (_func_int **)&PTR__AABBNoLeafTree_0024e3d8;
  pAVar1 = this->mNodes;
  if (pAVar1 != (AABBNoLeafNode *)0x0) {
    operator_delete__(&pAVar1[-1].mNegData,pAVar1[-1].mNegData * 0x28 + 8);
    this->mNodes = (AABBNoLeafNode *)0x0;
  }
  return;
}

Assistant:

AABBNoLeafTree::~AABBNoLeafTree()
{
	DELETEARRAY(mNodes);
}